

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O3

void ImGuiStb::stb_textedit_discard_undo(StbUndoState *state)

{
  short sVar1;
  short sVar2;
  short sVar3;
  long lVar4;
  
  sVar3 = state->undo_point;
  if (0 < sVar3) {
    if (-1 < state->undo_rec[0].char_storage) {
      sVar1 = state->undo_rec[0].insert_length;
      sVar3 = state->undo_char_point - sVar1;
      state->undo_char_point = sVar3;
      memmove(state->undo_char,state->undo_char + sVar1,(long)sVar3 * 2);
      sVar3 = state->undo_point;
      if (0 < (long)sVar3) {
        lVar4 = 0;
        do {
          sVar2 = *(short *)((long)&state->undo_rec[0].char_storage + lVar4);
          if (-1 < sVar2) {
            *(short *)((long)&state->undo_rec[0].char_storage + lVar4) = sVar2 - sVar1;
          }
          lVar4 = lVar4 + 0xc;
        } while ((long)sVar3 * 0xc != lVar4);
      }
    }
    state->undo_point = sVar3 + -1;
    memmove(state,state->undo_rec + 1,(long)(short)(sVar3 + -1) * 0xc);
    return;
  }
  return;
}

Assistant:

static void stb_textedit_discard_undo(StbUndoState *state)
{
   if (state->undo_point > 0) {
      // if the 0th undo state has characters, clean those up
      if (state->undo_rec[0].char_storage >= 0) {
         int n = state->undo_rec[0].insert_length, i;
         // delete n characters from all other records
         state->undo_char_point = state->undo_char_point - (short) n;  // vsnet05
         STB_TEXTEDIT_memmove(state->undo_char, state->undo_char + n, (size_t) ((size_t)state->undo_char_point*sizeof(STB_TEXTEDIT_CHARTYPE)));
         for (i=0; i < state->undo_point; ++i)
            if (state->undo_rec[i].char_storage >= 0)
               state->undo_rec[i].char_storage = state->undo_rec[i].char_storage - (short) n; // vsnet05 // @OPTIMIZE: get rid of char_storage and infer it
      }
      --state->undo_point;
      STB_TEXTEDIT_memmove(state->undo_rec, state->undo_rec+1, (size_t) ((size_t)state->undo_point*sizeof(state->undo_rec[0])));
   }
}